

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O3

void __thiscall QAbstractButton::changeEvent(QAbstractButton *this,QEvent *e)

{
  QAbstractButtonPrivate *this_00;
  
  this_00 = *(QAbstractButtonPrivate **)&(this->super_QWidget).field_0x8;
  if (*(short *)(e + 8) == 0x62) {
    if (((((this->super_QWidget).data)->widget_attributes & 1) != 0) &&
       ((this_00->field_0x28c & 0x10) != 0)) {
      this_00->field_0x28c = this_00->field_0x28c & 0xef;
      QAbstractButtonPrivate::emitReleased(this_00);
    }
  }
  else {
    (this_00->sizeHint).wd = -1;
    (this_00->sizeHint).ht = -1;
  }
  QWidget::changeEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QAbstractButton::changeEvent(QEvent *e)
{
    Q_D(QAbstractButton);
    switch (e->type()) {
    case QEvent::EnabledChange:
        if (!isEnabled() && d->down) {
            d->down = false;
            d->emitReleased();
        }
        break;
    default:
        d->sizeHint = QSize();
        break;
    }
    QWidget::changeEvent(e);
}